

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwGetFramebufferSize(GLFWwindow *handle,int *width,int *height)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/window.c"
                  ,0x287,"void glfwGetFramebufferSize(GLFWwindow *, int *, int *)");
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetFramebufferSize((_GLFWwindow *)handle,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetFramebufferSize(GLFWwindow* handle, int* width, int* height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetFramebufferSize(window, width, height);
}